

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

bool __thiscall
ctemplate::TemplateCache::ExpandNoLoad
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data,
          ExpandEmitter *expand_emitter)

{
  RefcountedTemplate *this_00;
  bool bVar1;
  int iVar2;
  pthread_rwlock_t *ppVar3;
  iterator iVar4;
  ReaderMutexLock ml;
  WriterMutexLock ml_1;
  ReaderMutexLock local_48;
  key_type local_40;
  
  ppVar3 = (pthread_rwlock_t *)TemplateString::GetGlobalId(filename);
  local_48.mu_ = this->mutex_;
  if ((((pthread_rwlock_t *)((long)local_48.mu_ + 0x38))->__size[0] == '\x01') &&
     (iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_48.mu_), iVar2 != 0)) {
LAB_001219c1:
    abort();
  }
  if (this->is_frozen_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"DFATAL: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": ExpandNoLoad() only works on frozen caches.",0x2d);
  }
  else {
    local_40.first = (unsigned_long)ppVar3;
    local_40.second = strip;
    iVar4 = std::
            _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->parsed_template_cache_->_M_h,&local_40);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
        ._M_cur != (__node_type *)0x0) {
      this_00 = *(RefcountedTemplate **)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                        ._M_cur + 0x18);
      RefcountedTemplate::IncRef(this_00);
      ReaderMutexLock::~ReaderMutexLock(&local_48);
      bVar1 = Template::ExpandWithDataAndCache
                        (this_00->ptr_,expand_emitter,dict,per_expand_data,this);
      local_40.first = (unsigned_long)this->mutex_;
      if ((((pthread_rwlock_t *)(local_40.first + 0x38))->__size[0] != '\x01') ||
         (iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_40.first), iVar2 == 0)) {
        RefcountedTemplate::DecRefN(this_00,1);
        WriterMutexLock::~WriterMutexLock((WriterMutexLock *)&local_40);
        return bVar1;
      }
      goto LAB_001219c1;
    }
  }
  ReaderMutexLock::~ReaderMutexLock(&local_48);
  return false;
}

Assistant:

bool TemplateCache::ExpandNoLoad(
    const TemplateString& filename,
    Strip strip,
    const TemplateDictionaryInterface *dict,
    PerExpandData *per_expand_data,
    ExpandEmitter *expand_emitter) const {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  CachedTemplate cached_tpl;
  {
    ReaderMutexLock ml(mutex_);
    if (!is_frozen_) {
      LOG(DFATAL) << ": ExpandNoLoad() only works on frozen caches.";
      return false;
    }
    CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
    if (!it) {
      return false;
    }
    cached_tpl = *it;
    cached_tpl.refcounted_tpl->IncRef();
  }
  const bool result = cached_tpl.refcounted_tpl->tpl()->ExpandWithDataAndCache(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    cached_tpl.refcounted_tpl->DecRef();
  }
  return result;
}